

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::Compiler::get_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration)

{
  bool bVar1;
  Meta *pMVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)id);
  uVar4 = 0;
  if (pMVar2 != (Meta *)0x0) {
    bVar1 = Bitset::get(&(pMVar2->decoration).extended.flags,decoration);
    if (bVar1) {
      puVar3 = (pMVar2->decoration).extended.values + decoration;
    }
    else {
      if (5 < decoration - SPIRVCrossDecorationInterfaceMemberIndex) {
        return 0;
      }
      puVar3 = (uint32_t *)
               (&DAT_003b663c + (ulong)(decoration - SPIRVCrossDecorationInterfaceMemberIndex) * 4);
    }
    uVar4 = *puVar3;
  }
  return uVar4;
}

Assistant:

uint32_t Compiler::get_extended_decoration(uint32_t id, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return 0;

	auto &dec = m->decoration;

	if (!dec.extended.flags.get(decoration))
		return get_default_extended_decoration(decoration);

	return dec.extended.values[decoration];
}